

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::create(Forth *this)

{
  uint uVar1;
  char *name_00;
  undefined1 local_78 [8];
  string name;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  ulong uStack_18;
  CAddr caddr;
  size_t length;
  Forth *this_local;
  
  length = (size_t)this;
  alignDataPointer(this);
  bl(this);
  word(this);
  count(this);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  uStack_18 = (ulong)uVar1;
  pop(this);
  local_1c = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (uStack_18 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CREATE: could not parse name",&local_41);
    throwCppExceptionMessage(this,&local_40,errorParsedStringOverflow);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  std::__cxx11::string::string((string *)local_78);
  assignStringFromCaddress(this,(string *)local_78,local_1c,uStack_18);
  name_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
  definePrimitive(this,name_00,0x129930,false);
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void create() {
			alignDataPointer();
			bl();
			word(); 
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();

			RUNTIME_ERROR_IF(length < 1, "CREATE: could not parse name",errorParsedStringOverflow);
			std::string name{};
			assignStringFromCaddress(name, CADDR(caddr), length);
			definePrimitive(name.c_str(), &Forth::doCreate, false);
		}